

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationIndex.cpp
# Opt level: O1

unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
 __thiscall
VariationIndex::_containedIn(VariationIndex *this,int chromosome_id,size_t start,size_t end)

{
  int iVar1;
  iterator __position;
  bool bVar2;
  bool bVar3;
  node_pointer ppVar4;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  iVar5;
  ulong uVar6;
  pointer pvVar7;
  node_pointer ppVar8;
  undefined1 *puVar9;
  long lVar10;
  unsigned_long *k;
  undefined4 in_register_00000034;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  ulong in_R8;
  ulong uVar14;
  long lVar15;
  emplace_return eVar16;
  unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  active_variations;
  int local_6c;
  size_t local_68;
  table<boost::unordered::detail::set<std::allocator<unsigned_long>,_unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>_>
  local_60;
  
  lVar10 = CONCAT44(in_register_00000034,chromosome_id);
  local_6c = (int)start;
  this->_vptr_VariationIndex = (_func_int **)0x0;
  local_68 = end;
  ppVar4 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
           ::find_node_impl<int,std::equal_to<int>>
                     ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
                       *)(lVar10 + 0x10),(long)local_6c,&local_6c,
                      (equal_to<int> *)((ulong)(*(byte *)(lVar10 + 0x10) & 1) + lVar10 + 0x11));
  if (ppVar4 != (node_pointer)0x0) {
    eVar16 = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
             ::try_emplace_unique<int_const&>
                       ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
                         *)(lVar10 + 0x10),&local_6c);
    iVar5 = eVar16.first.node_;
    uVar6 = (local_68 - 1) / *(ulong *)(lVar10 + 0x78);
    lVar10 = *(long *)((long)&((iVar5.node_)->value_base_).data_.data_ + 0x20);
    if (uVar6 < (ulong)(*(long *)((long)&((iVar5.node_)->value_base_).data_.data_ + 0x28) - lVar10
                       >> 5)) {
      local_60.super_functions<boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>.current_ =
           0;
      uVar11 = 0x26;
      puVar9 = boost::unordered::detail::prime_list_template<unsigned_long>::value;
      do {
        uVar13 = uVar11 >> 1;
        uVar14 = ~uVar13 + uVar11;
        uVar11 = uVar13;
        if (*(ulong *)((long)puVar9 + uVar13 * 8) < 0xb) {
          puVar9 = (undefined1 *)((ulong *)((long)puVar9 + uVar13 * 8) + 1);
          uVar11 = uVar14;
        }
      } while (0 < (long)uVar11);
      puVar12 = (ulong *)(boost::unordered::detail::prime_list_template<unsigned_long>::value +
                         0x128);
      if (puVar9 != &DAT_0019b950) {
        puVar12 = (ulong *)puVar9;
      }
      local_60.bucket_count_ = *puVar12;
      local_60.size_ = 0;
      local_60.mlf_ = 1.0;
      local_60.max_load_ = 0;
      local_60.buckets_ = (bucket_pointer)0x0;
      uVar6 = *(ulong *)(lVar10 + uVar6 * 0x20);
      lVar10 = *(long *)((long)&((iVar5.node_)->value_base_).data_.data_ + 8);
      if (uVar6 < (ulong)((*(long *)((long)&((iVar5.node_)->value_base_).data_.data_ + 0x10) -
                           lVar10 >> 3) * -0x5555555555555555)) {
        lVar15 = uVar6 * 0x18 + 8;
        do {
          uVar11 = *(ulong *)(lVar10 + -8 + lVar15);
          bVar2 = false;
          if ((local_68 <= uVar11) && (bVar2 = true, uVar11 <= in_R8)) {
            iVar1 = *(int *)(lVar10 + 8 + lVar15);
            bVar3 = false;
            bVar2 = false;
            if (iVar1 == 2) {
              k = (unsigned_long *)(lVar10 + lVar15);
              ppVar8 = boost::unordered::detail::
                       table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
                       ::find_node_impl<unsigned_long,std::equal_to<unsigned_long>>
                                 ((table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
                                   *)&local_60,*(size_t *)(lVar10 + lVar15),k,
                                  (equal_to<unsigned_long> *)
                                  (local_60.
                                   super_functions<boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>
                                   .funcs_ +
                                  (local_60.
                                   super_functions<boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>
                                   .current_ & 1)));
              if (ppVar8 != (node_pointer)0x0) {
                if (this->_vptr_VariationIndex == (_func_int **)0x0) {
                  pvVar7 = (pointer)operator_new(0x18);
                  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::
                  __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::reset((__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)this,pvVar7);
                }
                this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                          this->_vptr_VariationIndex;
LAB_00179f5a:
                __position._M_current = *(unsigned_long **)(this_00 + 8);
                if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>(this_00,__position,k);
                  bVar2 = bVar3;
                }
                else {
                  *__position._M_current = *k;
                  *(unsigned_long **)(this_00 + 8) = __position._M_current + 1;
                  bVar2 = bVar3;
                }
              }
            }
            else if (iVar1 == 1) {
              boost::unordered::detail::
              table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
              ::emplace_unique<unsigned_long_const&>
                        ((table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
                          *)&local_60,(const_key_type *)(lVar10 + lVar15),
                         (const_key_type *)(lVar10 + lVar15));
            }
            else {
              bVar2 = bVar3;
              if (iVar1 == 0) {
                if (this->_vptr_VariationIndex == (_func_int **)0x0) {
                  pvVar7 = (pointer)operator_new(0x18);
                  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::
                  __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::reset((__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)this,pvVar7);
                }
                this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                          this->_vptr_VariationIndex;
                k = (unsigned_long *)(lVar10 + uVar6 * 0x18 + 8);
                goto LAB_00179f5a;
              }
            }
          }
          if (bVar2) break;
          uVar6 = uVar6 + 1;
          lVar10 = *(long *)((long)&((iVar5.node_)->value_base_).data_.data_ + 8);
          lVar15 = lVar15 + 0x18;
        } while (uVar6 < (ulong)((*(long *)((long)&((iVar5.node_)->value_base_).data_.data_ + 0x10)
                                  - lVar10 >> 3) * -0x5555555555555555));
      }
      boost::unordered::detail::
      table<boost::unordered::detail::set<std::allocator<unsigned_long>,_unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>_>
      ::delete_buckets(&local_60);
    }
  }
  return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<size_t> > VariationIndex::_containedIn(int chromosome_id, size_t start, size_t end) {
	unique_ptr<vector<size_t> > result(nullptr);
	if (chromosomes.find(chromosome_id) == chromosomes.end()) {
		return result;
	}
	const chromosome_record_t& chromosome_record = chromosomes[chromosome_id];
	size_t k = (start-1) / step_size;
	if (chromosome_record.checkpoint_list.size() <= k) {
		return result;
	}
	const vector<event_t>& event_list = chromosome_record.events;
	boost::unordered_set<size_t> active_variations;
	for (size_t i=chromosome_record.checkpoint_list[k].index; i<event_list.size(); ++i) {
		const event_t& event = event_list[i];
		if (event.position < start) continue;
		if (event.position > end) break;
		switch (event.type) {
		case INSERTION:
			if (result.get() == 0) {
				result = unique_ptr<vector<size_t> >(new vector<size_t>());
			}
			result->push_back(event.variation_index);
			break;
		case DELETION_START:
			active_variations.insert(event.variation_index);
			break;
		case DELETION_END:
			if (active_variations.find(event.variation_index) != active_variations.end()) {
				if (result.get() == 0) {
					result = unique_ptr<vector<size_t> >(new vector<size_t>());
				}
				result->push_back(event.variation_index);
			}
			break;
		default:
			assert(false);
			break;
		}
	}
	return result;
}